

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O2

primitive_dictionary_entry_t * __thiscall
duckdb::PrimitiveDictionary<duckdb::hugeint_t,_double,_duckdb::ParquetHugeintOperator>::Lookup
          (PrimitiveDictionary<duckdb::hugeint_t,_double,_duckdb::ParquetHugeintOperator> *this,
          hugeint_t *value)

{
  bool bVar1;
  hash_t hVar2;
  int64_t in_RDX;
  primitive_dictionary_entry_t *ppVar3;
  ulong uVar4;
  hugeint_t val;
  
  val.upper = in_RDX;
  val.lower = value->upper;
  hVar2 = Hash<duckdb::hugeint_t>((duckdb *)value->lower,val);
  do {
    uVar4 = hVar2 & this->capacity_mask;
    ppVar3 = this->dictionary;
    if (ppVar3[uVar4].index == 0xffffffff) {
LAB_00de03b9:
      return ppVar3 + uVar4;
    }
    bVar1 = hugeint_t::operator!=(&ppVar3[uVar4].value,value);
    if (!bVar1) {
      ppVar3 = this->dictionary;
      goto LAB_00de03b9;
    }
    hVar2 = uVar4 + 1;
  } while( true );
}

Assistant:

primitive_dictionary_entry_t &Lookup(const SRC &value) const {
		auto offset = Hash(value) & capacity_mask;
		while (!dictionary[offset].IsEmpty() && dictionary[offset].value != value) {
			++offset &= capacity_mask;
		}
		return dictionary[offset];
	}